

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_stroke_polygon(nk_command_buffer *b,float *points,int point_count,float line_thickness,
                      nk_color col)

{
  void *pvVar1;
  undefined4 in_ECX;
  int in_EDX;
  nk_size in_RSI;
  long in_RDI;
  float in_XMM0_Da;
  nk_command_polygon *cmd;
  nk_size size;
  int i;
  int local_24;
  undefined4 in_stack_fffffffffffffff8;
  
  if (((in_RDI != 0) && ((char)((uint)in_ECX >> 0x18) != '\0')) &&
     (pvVar1 = nk_command_buffer_push
                         ((nk_command_buffer *)CONCAT44(in_ECX,in_stack_fffffffffffffff8),
                          (nk_command_type)((ulong)in_RDI >> 0x20),in_RSI), pvVar1 != (void *)0x0))
  {
    *(undefined4 *)((long)pvVar1 + 0x10) = in_ECX;
    *(short *)((long)pvVar1 + 0x14) = (short)(int)in_XMM0_Da;
    *(short *)((long)pvVar1 + 0x16) = (short)in_EDX;
    for (local_24 = 0; local_24 < in_EDX; local_24 = local_24 + 1) {
      *(short *)((long)pvVar1 + (long)local_24 * 4 + 0x18) =
           (short)(int)*(float *)(in_RSI + (long)(local_24 * 2) * 4);
      *(short *)((long)pvVar1 + (long)local_24 * 4 + 0x1a) =
           (short)(int)*(float *)(in_RSI + 4 + (long)(local_24 * 2) * 4);
    }
  }
  return;
}

Assistant:

NK_API void
nk_stroke_polygon(struct nk_command_buffer *b,  float *points, int point_count,
    float line_thickness, struct nk_color col)
{
    int i;
    nk_size size = 0;
    struct nk_command_polygon *cmd;

    NK_ASSERT(b);
    if (!b || col.a == 0) return;
    size = sizeof(*cmd) + sizeof(short) * 2 * (nk_size)point_count;
    cmd = (struct nk_command_polygon*) nk_command_buffer_push(b, NK_COMMAND_POLYGON, size);
    if (!cmd) return;
    cmd->color = col;
    cmd->line_thickness = (unsigned short)line_thickness;
    cmd->point_count = (unsigned short)point_count;
    for (i = 0; i < point_count; ++i) {
        cmd->points[i].x = (short)points[i*2];
        cmd->points[i].y = (short)points[i*2+1];
    }
}